

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int timeout_next(event_base *base,timeval **tv_p)

{
  timeval *ptVar1;
  int iVar2;
  event *peVar3;
  int res;
  timeval *tv;
  event *ev;
  timeval now;
  timeval **tv_p_local;
  event_base *base_local;
  
  ptVar1 = *tv_p;
  now.tv_usec = (__suseconds_t)tv_p;
  peVar3 = min_heap_top_(&base->timeheap);
  if (peVar3 == (event *)0x0) {
    *(undefined8 *)now.tv_usec = 0;
    return 0;
  }
  iVar2 = gettime(base,(timeval *)&ev);
  if (iVar2 == -1) {
    return -1;
  }
  if ((event *)(peVar3->ev_timeout).tv_sec == ev) {
    if ((peVar3->ev_timeout).tv_usec <= now.tv_sec) {
LAB_00313467:
      ptVar1->tv_usec = 0;
      ptVar1->tv_sec = 0;
      return 0;
    }
  }
  else if ((peVar3->ev_timeout).tv_sec <= (long)ev) goto LAB_00313467;
  ptVar1->tv_sec = (peVar3->ev_timeout).tv_sec - (long)ev;
  ptVar1->tv_usec = (peVar3->ev_timeout).tv_usec - now.tv_sec;
  if (ptVar1->tv_usec < 0) {
    ptVar1->tv_sec = ptVar1->tv_sec + -1;
    ptVar1->tv_usec = ptVar1->tv_usec + 1000000;
  }
  if (-1 < ptVar1->tv_sec) {
    if (-1 < ptVar1->tv_usec) {
      if (event_debug_logging_mask_ != 0) {
        event_debugx_("timeout_next: event: %p, in %d seconds, %d useconds",peVar3,
                      ptVar1->tv_sec & 0xffffffff,ptVar1->tv_usec & 0xffffffff);
      }
      return 0;
    }
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xc67,"tv->tv_usec >= 0","timeout_next");
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
             ,0xc66,"tv->tv_sec >= 0","timeout_next");
}

Assistant:

static int
timeout_next(struct event_base *base, struct timeval **tv_p)
{
	/* Caller must hold th_base_lock */
	struct timeval now;
	struct event *ev;
	struct timeval *tv = *tv_p;
	int res = 0;

	ev = min_heap_top_(&base->timeheap);

	if (ev == NULL) {
		/* if no time-based events are active wait for I/O */
		*tv_p = NULL;
		goto out;
	}

	if (gettime(base, &now) == -1) {
		res = -1;
		goto out;
	}

	if (evutil_timercmp(&ev->ev_timeout, &now, <=)) {
		evutil_timerclear(tv);
		goto out;
	}

	evutil_timersub(&ev->ev_timeout, &now, tv);

	EVUTIL_ASSERT(tv->tv_sec >= 0);
	EVUTIL_ASSERT(tv->tv_usec >= 0);
	event_debug(("timeout_next: event: %p, in %d seconds, %d useconds", ev, (int)tv->tv_sec, (int)tv->tv_usec));

out:
	return (res);
}